

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryPushJavascriptArray
              (ScriptContext *scriptContext,JavascriptArray *arr,Var *args,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  JavascriptCopyOnAccessNativeIntArray *this;
  Var pvVar4;
  uint64 uVar5;
  uint64 uVar6;
  undefined4 *puVar7;
  ulong uVar8;
  uint32 itemIndex;
  uint uVar9;
  double value;
  
  if (((arr != (JavascriptArray *)0x0) &&
      (bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(arr), bVar2)) &&
     (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(arr),
     this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
  }
  uVar9 = (arr->super_ArrayObject).length;
  if (uVar9 == 0xffffffff || argCount != 1) {
    if (((~uVar9 <= argCount) || (bVar2 = IsVarArray(arr), !bVar2)) ||
       ((((((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr != scriptContext))
    {
      pvVar4 = EntryPushJavascriptArrayNoFastPath(scriptContext,arr,args,argCount);
      return pvVar4;
    }
    if (argCount != 0) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar8 = 0;
      do {
        itemIndex = uVar9 + (int)uVar8;
        if (itemIndex == 0xffffffff) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x152f,"(n != JavascriptArray::MaxArrayLength)",
                                      "n != JavascriptArray::MaxArrayLength");
          if (!bVar2) goto LAB_00b78098;
          *puVar7 = 0;
          itemIndex = 0xffffffff;
        }
        DirectSetItemAt<void*>(arr,itemIndex,args[uVar8]);
        uVar8 = uVar8 + 1;
      } while (argCount != uVar8);
      uVar9 = (int)uVar8 + uVar9;
    }
    if ((int)uVar9 < 0) {
      uVar8 = (ulong)uVar9;
      goto LAB_00b77f00;
    }
    uVar8 = (ulong)uVar9;
  }
  else {
    iVar3 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(arr,(ulong)uVar9,*args,0);
    if (iVar3 == 0) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
    }
    uVar8 = (ulong)uVar9 + 1;
    if ((int)uVar8 < 0) {
      uVar8 = uVar8 & 0xffffffff;
LAB_00b77f00:
      value = (double)uVar8;
      uVar5 = NumberUtilities::ToSpecial(value);
      bVar2 = NumberUtilities::IsNan(value);
      if (((bVar2) && (uVar6 = NumberUtilities::ToSpecial(value), uVar6 != 0xfff8000000000000)) &&
         (uVar6 = NumberUtilities::ToSpecial(value), uVar6 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
LAB_00b78098:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      return (Var)(uVar5 ^ 0xfffc000000000000);
    }
  }
  return (Var)(uVar8 | 0x1000000000000);
}

Assistant:

Var JavascriptArray::EntryPushJavascriptArray(ScriptContext * scriptContext, JavascriptArray * arr, Var * args, uint argCount)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arr);
#endif

        uint n = arr->length;
        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));

        // Fast Path for one push for small indexes
        if (argCount == 1 && n < JavascriptArray::MaxArrayLength)
        {
            // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
            h.ThrowTypeErrorOnFailure(arr->SetItem(n, args[0], PropertyOperation_None));
            return JavascriptNumber::ToVar(n + 1, scriptContext);
        }

        // Fast Path for multiple push for small indexes
        if (argCount < JavascriptArray::MaxArrayLength - n && JavascriptArray::IsVarArray(arr) && scriptContext == arr->GetScriptContext())
        {
            uint index;
            for (index = 0; index < argCount; ++index, ++n)
            {
                Assert(n != JavascriptArray::MaxArrayLength);
                // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
                arr->JavascriptArray::DirectSetItemAt(n, args[index]);
            }
            return JavascriptNumber::ToVar(n, scriptContext);
        }

        return EntryPushJavascriptArrayNoFastPath(scriptContext, arr, args, argCount);
    }